

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O3

void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *p,int nSupersMax)

{
  int iVar1;
  long *__base;
  Map_Super_t *pMVar2;
  ulong uVar3;
  uint uVar4;
  Map_HashEntry_t *pMVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  __base = (long *)malloc((long)nSupersMax << 3);
  iVar1 = p->nBins;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      pMVar5 = p->pBins[lVar7];
      if (pMVar5 != (Map_HashEntry_t *)0x0) {
        do {
          pMVar2 = pMVar5->pGates;
          if (pMVar2 != (Map_Super_t *)0x0) {
            uVar8 = 0;
            uVar4 = 1;
            uVar3 = 0;
            do {
              uVar6 = (ulong)uVar4;
              __base[uVar3] = (long)pMVar2;
              uVar3 = uVar3 + 1;
              pMVar2 = pMVar2->pNext;
              uVar8 = uVar8 + 0x1000;
              uVar4 = uVar4 + 1;
            } while (pMVar2 != (Map_Super_t *)0x0);
            pMVar5->pGates = (Map_Super_t *)0x0;
            qsort(__base,uVar3 & 0xffffffff,8,Map_SuperTableCompareGatesInList);
            if (*(float *)(*__base + 0xec) <= *(float *)(__base[(uVar3 & 0xffffffff) - 1] + 0xec) &&
                *(float *)(__base[(uVar3 & 0xffffffff) - 1] + 0xec) != *(float *)(*__base + 0xec)) {
              __assert_fail("Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                            ,0x184,
                            "void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *, int)");
            }
            pMVar2 = pMVar5->pGates;
            uVar3 = 0;
            do {
              *(Map_Super_t **)(__base[uVar3] + 0xf8) = pMVar2;
              pMVar2 = (Map_Super_t *)__base[uVar3];
              pMVar5->pGates = pMVar2;
              uVar3 = uVar3 + 1;
            } while (uVar6 != uVar3);
            *(uint *)&pMVar2->field_0x4 =
                 *(uint *)&pMVar2->field_0x4 & 0xf0000fff | uVar8 & 0xffff000;
          }
          pMVar5 = pMVar5->pNext;
        } while (pMVar5 != (Map_HashEntry_t *)0x0);
        iVar1 = p->nBins;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < iVar1);
  }
  if (__base != (long *)0x0) {
    free(__base);
    return;
  }
  return;
}

Assistant:

void Map_SuperTableSortSupergatesByDelay( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i, k;

    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
        {
            // collect the gates in this entry
            nSupers = 0;
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
            {
                // skip supergates, whose root is the AND gate
//                if ( strcmp( Mio_GateReadName(pSuper->pRoot), "and" ) == 0 )
//                    continue;
                ppSupers[nSupers++] = pSuper;
            }
            pEnt->pGates = NULL;
            if ( nSupers == 0 )
                continue;
            // sort the gates by delay
            qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
                    (int (*)(const void *, const void *)) Map_SuperTableCompareGatesInList );
            assert( Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0 );
            // link them in the reverse order
            for ( k = 0; k < nSupers; k++ )
            {
                ppSupers[k]->pNext = pEnt->pGates;
                pEnt->pGates = ppSupers[k];
            }
            // save the number of supergates in the list
            pEnt->pGates->nSupers = nSupers;
        }
    ABC_FREE( ppSupers );
}